

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O1

void QSslSocketPrivate::addDefaultCaCertificate(QSslCertificate *cert)

{
  __pointer_type pQVar1;
  QSslConfigurationPrivate *pQVar2;
  Type *pTVar3;
  Type *pTVar4;
  qsizetype qVar5;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_> *pQVar6;
  QList<QSslCertificate> *this;
  bool bVar7;
  
  pTVar4 = (Type *)cert;
  ensureInitialized();
  pTVar3 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::
           operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>
                       *)pTVar4);
  if (pTVar3 != (Type *)0x0) {
    if ((pTVar3->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
      LOCK();
      bVar7 = (pTVar3->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
      if (bVar7) {
        (pTVar3->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
      }
      UNLOCK();
      if (bVar7) goto LAB_0016e904;
    }
    pTVar4 = pTVar3;
    QBasicMutex::lockInternal();
  }
LAB_0016e904:
  pTVar4 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::
           operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>
                       *)pTVar4);
  pQVar6 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_> *)
           &((pTVar4->config).d.ptr)->caCertificates;
  qVar5 = QtPrivate::indexOf<QSslCertificate,QSslCertificate>
                    ((QList<QSslCertificate> *)pQVar6,cert,0);
  if (qVar5 == -1) {
    pTVar4 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::
             operator()(pQVar6);
    pQVar2 = (pTVar4->config).d.ptr;
    if ((pQVar2 != (QSslConfigurationPrivate *)0x0) &&
       ((__int_type)
        (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> != 1)) {
      pQVar6 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_> *)
               &pTVar4->config;
      QExplicitlySharedDataPointer<QSslConfigurationPrivate>::detach_helper
                ((QExplicitlySharedDataPointer<QSslConfigurationPrivate> *)pQVar6);
    }
    pTVar4 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::
             operator()(pQVar6);
    pQVar2 = (pTVar4->config).d.ptr;
    pQVar6 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_> *)
             &pQVar2->caCertificates;
    QtPrivate::QMovableArrayOps<QSslCertificate>::emplace<QSslCertificate_const&>
              ((QMovableArrayOps<QSslCertificate> *)pQVar6,(pQVar2->caCertificates).d.size,cert);
    QList<QSslCertificate>::end((QList<QSslCertificate> *)pQVar6);
    pTVar4 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::
             operator()(pQVar6);
    pQVar2 = (pTVar4->dtlsConfig).d.ptr;
    if ((pQVar2 != (QSslConfigurationPrivate *)0x0) &&
       ((__int_type)
        (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> != 1)) {
      pQVar6 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_> *)
               &pTVar4->dtlsConfig;
      QExplicitlySharedDataPointer<QSslConfigurationPrivate>::detach_helper
                ((QExplicitlySharedDataPointer<QSslConfigurationPrivate> *)pQVar6);
    }
    pTVar4 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::
             operator()(pQVar6);
    pQVar2 = (pTVar4->dtlsConfig).d.ptr;
    this = &pQVar2->caCertificates;
    QtPrivate::QMovableArrayOps<QSslCertificate>::emplace<QSslCertificate_const&>
              ((QMovableArrayOps<QSslCertificate> *)this,(pQVar2->caCertificates).d.size,cert);
    QList<QSslCertificate>::end(this);
  }
  if (pTVar3 != (Type *)0x0) {
    LOCK();
    pQVar1 = (pTVar3->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p;
    (pTVar3->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    if (pQVar1 != (__pointer_type)0x1) {
      QBasicMutex::unlockInternalFutex(pTVar3);
      return;
    }
  }
  return;
}

Assistant:

void QSslSocketPrivate::addDefaultCaCertificate(const QSslCertificate &cert)
{
    QSslSocketPrivate::ensureInitialized();
    QMutexLocker locker(&globalData()->mutex);
    if (globalData()->config->caCertificates.contains(cert))
        return;
    globalData()->config.detach();
    globalData()->config->caCertificates += cert;
    globalData()->dtlsConfig.detach();
    globalData()->dtlsConfig->caCertificates += cert;
}